

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2tt.cpp
# Opt level: O2

bool IsSegmentApproximationClose(double tmin,double tmax,Coeff2 coeff,SegmentQ s,double error)

{
  double dVar1;
  Point p;
  double dVar2;
  
  dVar1 = tmax - tmin;
  do {
    tmin = tmin + dVar1 * 0.25;
    if (tmax + -1e-06 <= tmin) break;
    p.x = ((tmin * coeff._M_elems[3].x + coeff._M_elems[2].x) * tmin + coeff._M_elems[1].x) * tmin +
          coeff._M_elems[0].x;
    p.y = ((tmin * coeff._M_elems[3].y + coeff._M_elems[2].y) * tmin + coeff._M_elems[1].y) * tmin +
          coeff._M_elems[0].y;
    dVar2 = MinDistanceToQuad(p,s);
  } while (dVar2 <= error);
  return tmax + -1e-06 <= tmin;
}

Assistant:

bool IsSegmentApproximationClose(double tmin, double tmax, Coeff2 coeff,
                                 SegmentQ s, double error)
{
	int n = 4;
	double dt = (tmax - tmin) / n;
	for (double t = tmin + dt; t < tmax - 1e-6; t += dt)
	{
		Point p = CalcPoint(t, coeff);
		if (MinDistanceToQuad(p, s) > error)
			return false;
	}
	return true;
}